

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_text_wrap_colored(nk_context *ctx,char *str,int len,nk_color color)

{
  nk_window *pnVar1;
  nk_user_font *font;
  char *pcVar2;
  undefined1 auVar3 [16];
  int len_00;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  nk_rect b;
  float width;
  nk_rect bounds;
  int local_a8;
  float local_a4;
  char *local_a0;
  nk_vec2 local_98;
  undefined8 uStack_90;
  nk_rect local_88;
  float local_78;
  float fStack_74;
  undefined8 uStack_70;
  undefined1 local_68 [24];
  nk_text local_50;
  nk_rect local_40;
  
  local_a0 = str;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4bb4,
                  "void nk_text_wrap_colored(struct nk_context *, const char *, int, struct nk_color)"
                 );
  }
  pnVar1 = ctx->current;
  if (pnVar1 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4bb5,
                  "void nk_text_wrap_colored(struct nk_context *, const char *, int, struct nk_color)"
                 );
  }
  if (pnVar1->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4bb6,
                  "void nk_text_wrap_colored(struct nk_context *, const char *, int, struct nk_color)"
                 );
  }
  nk_panel_alloc_space(&local_40,ctx);
  local_98 = (ctx->style).text.padding;
  fVar6 = local_98.x;
  local_50.background = (ctx->style).window.background;
  font = (ctx->style).font;
  local_88.x = local_40.x;
  local_88.y = local_40.y;
  local_88.w = 0.0;
  local_88.h = 0.0;
  local_50.padding.x = 0.0;
  local_50.padding.y = 0.0;
  local_78 = local_40.w;
  fStack_74 = local_40.h;
  uStack_70 = 0;
  fVar5 = fVar6 + fVar6;
  if (fVar6 + fVar6 <= local_40.w) {
    fVar5 = local_40.w;
  }
  uStack_90 = 0;
  fVar5 = fVar6 * -2.0 + fVar5;
  local_68._4_4_ = local_98.y * 2.0 + font->height;
  local_68._0_4_ = fVar5;
  local_68._8_4_ = local_98.y + 0.0;
  local_68._12_4_ = 0;
  local_50.text = color;
  len_00 = nk_text_clamp(font,local_a0,len,fVar5,&local_a8,&local_a4,&nk_widget_text_wrap_seperator,
                         1);
  if ((0 < len) && (len_00 != 0)) {
    fVar6 = local_98.x + local_88.x;
    fVar7 = local_98.y + local_88.y;
    uStack_70._0_4_ = (float)uStack_90 + local_88.w;
    uStack_70._4_4_ = uStack_90._4_4_ + local_88.h;
    fVar8 = local_98.y + local_98.y;
    fVar5 = fVar8;
    if (fVar8 <= fStack_74) {
      fVar5 = fStack_74;
    }
    local_88.x = local_88.y + (fVar5 - fVar8);
    local_88.h = local_88.y;
    local_88.w = local_88.y;
    iVar4 = 0;
    local_98.x = local_98.y + local_98.y;
    uStack_90 = CONCAT44(local_98.y,local_98.y);
    local_78 = fVar6;
    while( true ) {
      auVar3 = local_68._0_16_;
      pcVar2 = local_a0;
      if (local_88.x <= (float)local_68._4_4_ + fVar7) break;
      b.y = fVar7;
      b.x = local_78;
      b.w = (float)local_68._0_4_;
      b.h = (float)local_68._4_4_;
      local_68._0_16_ = auVar3;
      fStack_74 = fVar7;
      nk_widget_text(&pnVar1->buffer,b,local_a0 + iVar4,len_00,&local_50,0x11,font);
      iVar4 = iVar4 + len_00;
      fVar7 = font->height + local_98.x;
      len_00 = nk_text_clamp(font,pcVar2 + iVar4,len - iVar4,(float)local_68._0_4_,&local_a8,
                             &local_a4,&nk_widget_text_wrap_seperator,1);
      if (len <= iVar4) {
        return;
      }
      fVar7 = fStack_74 + fVar7;
      if (len_00 == 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

NK_API void
nk_text_wrap_colored(struct nk_context *ctx, const char *str,
    int len, struct nk_color color)
{
    struct nk_window *win;
    const struct nk_style *style;

    struct nk_vec2 item_padding;
    struct nk_rect bounds;
    struct nk_text text;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout) return;

    win = ctx->current;
    style = &ctx->style;
    nk_panel_alloc_space(&bounds, ctx);
    item_padding = style->text.padding;

    text.padding.x = item_padding.x;
    text.padding.y = item_padding.y;
    text.background = style->window.background;
    text.text = color;
    nk_widget_text_wrap(&win->buffer, bounds, str, len, &text, style->font);
}